

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_dc_predictor_64x16_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint8_t *in_RCX;
  undefined8 in_XMM0_Qa;
  undefined8 uVar5;
  undefined8 in_XMM0_Qb;
  undefined8 uVar6;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qb;
  __m256i row;
  uint16_t sum;
  __m256i sum_left;
  __m256i sum_above;
  uint8_t *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  __m256i *in_stack_fffffffffffffe50;
  undefined1 local_1a2;
  undefined8 local_1a0;
  uint8_t *in_stack_fffffffffffffef0;
  undefined8 uStack_68;
  
  dc_sum_64(in_stack_fffffffffffffef0);
  uVar5 = in_XMM0_Qa;
  uVar6 = in_XMM0_Qb;
  dc_sum_16_sse2(in_RCX);
  auVar4._8_8_ = uVar6;
  auVar4._0_8_ = uVar5;
  auVar4._16_8_ = local_1a0;
  auVar4._24_8_ = in_XMM1_Qb;
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  auVar3 = vpaddw_avx2(auVar4,auVar3);
  local_1a2 = (byte)((ulong)(ushort)(auVar3._0_2_ + 0x28) * 0x3333334 >> 0x20);
  auVar1 = vpinsrb_avx(ZEXT116(local_1a2),(uint)local_1a2,1);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,2);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,3);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,4);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,5);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,6);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,7);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,8);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,9);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,10);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,0xe);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_1a2,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(local_1a2),(uint)local_1a2,1);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,2);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,3);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,4);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,5);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,6);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,7);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,8);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,9);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,10);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,0xb);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,0xc);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,0xd);
  auVar2 = vpinsrb_avx(auVar2,(uint)local_1a2,0xe);
  vpinsrb_avx(auVar2,(uint)local_1a2,0xf);
  uStack_68 = SUB168(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1,8);
  row_store_64xh(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40,
                 uStack_68);
  return;
}

Assistant:

void aom_dc_predictor_64x16_avx2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  const __m256i sum_above = dc_sum_64(above);
  __m256i sum_left = _mm256_castsi128_si256(dc_sum_16_sse2(left));
  sum_left = _mm256_add_epi16(sum_left, sum_above);
  uint16_t sum = (uint16_t)_mm_cvtsi128_si32(_mm256_castsi256_si128(sum_left));
  sum += 40;
  sum /= 80;
  const __m256i row = _mm256_set1_epi8((int8_t)sum);
  row_store_64xh(&row, 16, dst, stride);
}